

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

int Gia_ManDumpUntests(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,int nFuncVars,char *pFileName,
                      int fVerbose)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  Vec_Int_t *p;
  Gia_Obj_t *pObj;
  uint uVar6;
  ulong uVar7;
  
  __stream = fopen(pFileName,"wb");
  p = Vec_IntAlloc(pM->vCis->nSize - (pM->nRegs + nFuncVars));
  uVar6 = 0;
  do {
    if (uVar6 == 10000) {
LAB_00467811:
      Vec_IntFree(p);
      fclose(__stream);
      return uVar6;
    }
    iVar2 = sat_solver_solve(pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar2 == 0) {
      printf("Timeout reached after dumping %d untestable faults.\n",(ulong)uVar6);
      goto LAB_00467811;
    }
    if (iVar2 + 1U < 2) goto LAB_00467811;
    p->nSize = 0;
    for (iVar2 = 0; iVar2 < pM->vCis->nSize - pM->nRegs; iVar2 = iVar2 + 1) {
      pObj = Gia_ManCi(pM,iVar2);
      if (pObj == (Gia_Obj_t *)0x0) break;
      if (nFuncVars <= iVar2) {
        piVar1 = pCnf->pVarNums;
        iVar3 = Gia_ObjId(pM,pObj);
        iVar3 = piVar1[iVar3];
        piVar1 = pCnf->pVarNums;
        iVar4 = Gia_ObjId(pM,pObj);
        iVar4 = sat_solver_var_value(pSat,piVar1[iVar4]);
        iVar3 = Abc_Var2Lit(iVar3,iVar4);
        Vec_IntPush(p,iVar3);
      }
    }
    iVar2 = p->nSize;
    iVar4 = 0;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    do {
      if (iVar3 == iVar4) goto LAB_004677e0;
      iVar5 = Vec_IntEntry(p,iVar4);
      iVar5 = Abc_LitIsCompl(iVar5);
      iVar4 = iVar4 + 1;
    } while (iVar5 == 0);
    if (fVerbose != 0) {
      printf("Untestable fault %4d : ");
      uVar7 = 0;
      while (iVar4 = (int)uVar7, iVar3 != iVar4) {
        iVar5 = Vec_IntEntry(p,iVar4);
        iVar5 = Abc_LitIsCompl(iVar5);
        if (iVar5 != 0) {
          printf("%d ",uVar7);
        }
        uVar7 = (ulong)(iVar4 + 1);
      }
      putchar(10);
    }
    uVar7 = 0;
    while (iVar4 = (int)uVar7, iVar3 != iVar4) {
      iVar5 = Vec_IntEntry(p,iVar4);
      iVar5 = Abc_LitIsCompl(iVar5);
      if (iVar5 != 0) {
        fprintf(__stream,"%d ",uVar7);
      }
      uVar7 = (ulong)(iVar4 + 1);
    }
    fputc(10,__stream);
LAB_004677e0:
    iVar2 = sat_solver_addclause(pSat,p->pArray,p->pArray + iVar2);
    if (iVar2 == 0) goto LAB_00467811;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int Gia_ManDumpUntests( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, int nFuncVars, char * pFileName, int fVerbose )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int nItersMax = 10000;
    int i, nIters, status, Value, Count = 0;
    vLits = Vec_IntAlloc( Gia_ManPiNum(pM) - nFuncVars );
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            printf( "Timeout reached after dumping %d untestable faults.\n", nIters );
        if ( status == l_Undef )
            break;
        if ( status == l_False )
            break;
        // collect literals
        Vec_IntClear( vLits );
        Gia_ManForEachPi( pM, pObj, i )
            if ( i >= nFuncVars )
                Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(pM, pObj)])) );
        // dump the fault
        Vec_IntForEachEntry( vLits, Value, i )
            if ( Abc_LitIsCompl(Value) )
                break;
        if ( i < Vec_IntSize(vLits) )
        {
            if ( fVerbose )
            {
                printf( "Untestable fault %4d : ", ++Count );
                Vec_IntForEachEntry( vLits, Value, i )
                    if ( Abc_LitIsCompl(Value) )
                        printf( "%d ", i );
                printf( "\n" );
            }
            Vec_IntForEachEntry( vLits, Value, i )
                if ( Abc_LitIsCompl(Value) )
                    fprintf( pFile, "%d ", i );
            fprintf( pFile, "\n" );
        }
        // add this clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            break;
    }
    Vec_IntFree( vLits );
    fclose( pFile );
    return nIters;
}